

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void dc_store_4xh(uint32_t dc,int height,uint8_t *dst,ptrdiff_t stride)

{
  int i;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  int height_local;
  uint32_t dc_local;
  
  dst_local = dst;
  for (i = 0; i < height; i = i + 2) {
    *(uint32_t *)dst_local = dc;
    *(uint32_t *)(dst_local + stride) = dc;
    dst_local = (uint8_t *)(stride + (long)(dst_local + stride));
  }
  return;
}

Assistant:

static inline void dc_store_4xh(uint32_t dc, int height, uint8_t *dst,
                                ptrdiff_t stride) {
  for (int i = 0; i < height; i += 2) {
    *(uint32_t *)dst = dc;
    dst += stride;
    *(uint32_t *)dst = dc;
    dst += stride;
  }
}